

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

void __thiscall
tf::UnboundedTaskQueue<tf::Node_*>::push(UnboundedTaskQueue<tf::Node_*> *this,Node *o)

{
  long lVar1;
  long lVar2;
  __pointer_type this_00;
  int64_t iVar3;
  Array *in_RDI;
  Array *a;
  int64_t t;
  int64_t b;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Array *in_stack_ffffffffffffff40;
  int64_t *piVar4;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int64_t in_stack_ffffffffffffff50;
  Array *a_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar5;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  lVar1 = in_RDI[5].M;
  a_00 = in_RDI;
  std::operator&(memory_order_acquire,__memory_order_mask);
  uVar5 = 2;
  lVar2 = a_00->C;
  this_00 = std::atomic<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>::load
                      ((atomic<tf::UnboundedTaskQueue<tf::Node_*>::Array_*> *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (memory_order)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  iVar3 = Array::capacity(this_00);
  if (iVar3 + -1 < lVar1 - lVar2) {
    resize_array((UnboundedTaskQueue<tf::Node_*> *)CONCAT44(uVar5,in_stack_ffffffffffffff60),a_00,
                 in_stack_ffffffffffffff50,
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  Array::push(in_stack_ffffffffffffff40,
              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),(Node *)0x11103b);
  piVar4 = &in_RDI[5].M;
  std::operator&(memory_order_release,__memory_order_mask);
  *piVar4 = lVar1 + 1;
  return;
}

Assistant:

void UnboundedTaskQueue<T>::push(T o) {

  int64_t b = _bottom.load(std::memory_order_relaxed);
  int64_t t = _top.load(std::memory_order_acquire);
  Array* a = _array.load(std::memory_order_relaxed);

  // queue is full with one additional item (b-t+1)
  if TF_UNLIKELY(a->capacity() - 1 < (b - t)) {
    a = resize_array(a, b, t);
  }